

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *param,
          SpectrumType spectrumType,Allocator alloc)

{
  pointer pfVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  Allocator alloc_00;
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  uintptr_t iptr;
  RGBSpectrum *pRVar7;
  BlackbodySpectrum *pBVar8;
  PiecewiseLinearSpectrum *pPVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  SpectrumHandle *pSVar12;
  ulong uVar13;
  size_type sVar14;
  uintptr_t uVar15;
  string *name;
  char *fmt;
  long lVar16;
  ParsedParameter *this_00;
  Float FVar17;
  long lVar18;
  ulong uVar19;
  RGBColorSpace *args;
  ulong uVar20;
  long lVar21;
  size_type sVar22;
  ulong uVar23;
  long lVar24;
  double dVar25;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *v;
  int local_264;
  ParameterDictionary *local_260;
  ParsedParameter *local_258;
  Allocator alloc_local;
  RGB local_248;
  vector<float,_std::allocator<float>_> lambda;
  vector<float,_std::allocator<float>_> value;
  ParsedParameter local_1d8;
  ParsedParameter local_108;
  Allocator *local_38;
  
  local_260 = this;
  alloc_local = alloc;
  bVar5 = std::operator==(&param->type,"rgb");
  local_258 = param;
  if ((bVar5) ||
     ((*(char *)(Options + 0xb) == '\x01' && (bVar5 = std::operator==(&param->type,"color"), bVar5))
     )) {
    local_264 = 3;
    uVar20 = (param->numbers).nStored;
    if (uVar20 != 0) {
      if (uVar20 % 3 != 0) {
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                   &param->name,&local_264);
      }
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,uVar20 / 3,(allocator_type *)&lambda);
      lVar21 = 2;
      uVar23 = 0;
      do {
        if (uVar20 / 3 == uVar23) {
          return __return_storage_ptr__;
        }
        pdVar3 = (local_258->numbers).ptr;
        auVar2 = *(undefined1 (*) [16])(pdVar3 + lVar21 + -2);
        pfVar1 = (pointer)pdVar3[lVar21];
        auVar4 = vcvtpd2ps_avx(auVar2);
        local_248.b = (Float)(double)pfVar1;
        local_248._0_8_ = vmovlps_avx(auVar4);
        args = local_258->colorSpace;
        if (args == (RGBColorSpace *)0x0) {
          args = local_260->colorSpace;
        }
        if (spectrumType == General) {
          __l_01._M_len = 3;
          __l_01._M_array = (iterator)&lambda;
          lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _0_16_ = auVar2;
          lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = pfVar1;
          dVar25 = std::min<double>(__l_01);
          if (dVar25 < 0.0) {
            ErrorExit(&local_258->loc,"RGB parameter \"%s\" has negative component value.");
          }
          pRVar7 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                             (&alloc_local,args,&local_248);
          uVar13 = 0x4000000000000;
        }
        else {
          if (spectrumType != Reflectance) {
            LogFatal<char_const(&)[38]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                       ,0x186,"Check failed: %s",
                       (char (*) [38])"spectrumType == SpectrumType::General");
          }
          __l._M_len = 3;
          __l._M_array = (iterator)&lambda;
          lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _0_16_ = auVar2;
          lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = pfVar1;
          dVar25 = std::min<double>(__l);
          if (dVar25 < 0.0) {
LAB_0027fb4b:
            ErrorExit<std::__cxx11::string_const&>
                      (&local_258->loc,
                       "RGB reflectance parameter \"%s\" has parameter outside of [0,1].",
                       &local_258->name);
          }
          value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)pdVar3[lVar21 + -2];
          value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)pdVar3[lVar21 + -1];
          value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pdVar3[lVar21];
          __l_00._M_len = 3;
          __l_00._M_array = (iterator)&value;
          dVar25 = std::max<double>(__l_00);
          if (1.0 < dVar25) goto LAB_0027fb4b;
          pRVar7 = (RGBSpectrum *)
                   pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::RGBReflectanceSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                             (&alloc_local,args,&local_248);
          uVar13 = 0x5000000000000;
        }
        lVar21 = lVar21 + 3;
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar23].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (ulong)pRVar7 | uVar13;
        uVar23 = uVar23 + 1;
      } while( true );
    }
  }
  else {
    bVar5 = std::operator==(&param->type,"blackbody");
    if (!bVar5) {
      bVar5 = std::operator==(&param->type,"spectrum");
      if ((!bVar5) || (uVar20 = (param->numbers).nStored, uVar20 == 0)) {
        bVar5 = std::operator==(&param->type,"spectrum");
        if ((!bVar5) || ((param->strings).nStored == 0)) {
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          return __return_storage_ptr__;
        }
        ParsedParameter::ParsedParameter(&local_108,param);
        local_38 = &alloc_local;
        sVar14 = (param->strings).nStored;
        if (sVar14 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,sVar14,(allocator_type *)&lambda);
        lVar21 = 0;
        for (sVar22 = 0; sVar14 != sVar22; sVar22 = sVar22 + 1) {
          name = (string *)((long)&(((local_258->strings).ptr)->_M_dataplus)._M_p + lVar21);
          GetNamedSpectrum((pbrt *)&local_248,name);
          if ((local_248._0_8_ & 0xffffffffffff) == 0) {
            alloc_00.memoryResource = local_38->memoryResource;
            ResolveFilename((string *)&lambda,name);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                             *)cachedSpectra_abi_cxx11_,(key_type *)&lambda);
            if (iVar10._M_node == (_Base_ptr)(cachedSpectra_abi_cxx11_ + 8)) {
              PiecewiseLinearSpectrum::Read
                        ((PiecewiseLinearSpectrum *)&value,(string *)&lambda,alloc_00);
              if ((char)value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish == '\0') {
                uVar15 = 0;
              }
              else {
                pSVar12 = pstd::optional<pbrt::SpectrumHandle>::value
                                    ((optional<pbrt::SpectrumHandle> *)&value);
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                        *)cachedSpectra_abi_cxx11_,(key_type *)&lambda);
                (pmVar11->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                ).bits = (pSVar12->
                         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                         ).bits;
                pSVar12 = pstd::optional<pbrt::SpectrumHandle>::value
                                    ((optional<pbrt::SpectrumHandle> *)&value);
                uVar15 = (pSVar12->
                         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                         ).bits;
              }
              pstd::optional<pbrt::SpectrumHandle>::~optional
                        ((optional<pbrt::SpectrumHandle> *)&value);
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                      *)cachedSpectra_abi_cxx11_,(key_type *)&lambda);
              uVar15 = (pmVar11->
                       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                       ).bits;
            }
            std::__cxx11::string::~string((string *)&lambda);
            local_248._0_8_ = uVar15;
            if ((uVar15 & 0xffffffffffff) == 0) {
              ErrorExit<std::__cxx11::string_const&>
                        (&local_108.loc,"%s: unable to read valid spectrum file",name);
            }
          }
          lVar21 = lVar21 + 0x20;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar22].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = local_248._0_8_;
        }
        this_00 = &local_108;
LAB_0027fb0a:
        ParsedParameter::~ParsedParameter(this_00);
        return __return_storage_ptr__;
      }
      if ((uVar20 & 1) == 0) {
        uVar6 = (uint)(uVar20 >> 1);
        ParsedParameter::ParsedParameter(&local_1d8,param);
        local_264 = (int)uVar20;
        uVar20 = (param->numbers).nStored;
        if (uVar20 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        local_260 = (ParameterDictionary *)(long)local_264;
        uVar23 = uVar20 / (ulong)local_260;
        if (uVar20 % (ulong)local_260 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     &param->name,&local_264);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,uVar23,(allocator_type *)&lambda);
        lVar24 = 0;
        lVar21 = (long)local_260 * 8;
        for (uVar20 = 0; uVar20 < uVar23; uVar20 = uVar20 + 1) {
          pdVar3 = (local_258->numbers).ptr;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)
                     &lambda.super__Vector_base<float,_std::allocator<float>_>,(long)(int)uVar6,
                     (allocator_type *)&value);
          std::vector<float,_std::allocator<float>_>::vector
                    (&value,(long)(int)uVar6,(allocator_type *)&local_248);
          lVar16 = 0;
          FVar17 = -NAN;
          lVar18 = 4;
          for (uVar13 = 0; (~((int)uVar6 >> 0x1f) & uVar6) * 2 != uVar13; uVar13 = uVar13 + 2) {
            if (uVar13 == 0) {
              dVar25 = pdVar3[uVar20 * (long)local_260];
              uVar19 = 0;
            }
            else {
              dVar25 = *(double *)((long)pdVar3 + uVar13 * 8 + lVar24);
              uVar19 = uVar13;
              if (dVar25 <= (double)*(float *)((long)lambda.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                              uVar13 * 2 + -4)) {
                local_248.r = FVar17;
                ErrorExit<int,float&,double_const&>
                          (&local_1d8.loc,
                           "Spectrum description invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                           ,(int *)&local_248,
                           (float *)((long)lambda.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_start - lVar18),
                           (double *)((long)pdVar3 + (lVar24 - lVar16)));
              }
            }
            lVar18 = lVar18 + -4;
            FVar17 = (Float)((int)FVar17 + 1);
            lVar16 = lVar16 + -0x10;
            *(float *)((long)lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar13 * 2) = (float)dVar25;
            *(float *)((long)value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar13 * 2) =
                 (float)(pdVar3 + uVar20 * (long)local_260)[uVar19 + 1];
          }
          pPVar9 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::PiecewiseLinearSpectrum,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                             (&alloc_local,
                              (vector<float,_std::allocator<float>_> *)
                              &lambda.super__Vector_base<float,_std::allocator<float>_>,&value,
                              &alloc_local);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&value);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&lambda.super__Vector_base<float,_std::allocator<float>_>);
          lVar24 = lVar24 + lVar21;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar20].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (ulong)pPVar9 | 0x3000000000000;
        }
        this_00 = &local_1d8;
        goto LAB_0027fb0a;
      }
      fmt = "Found odd number of values for \"%s\"";
      goto LAB_0027fbaa;
    }
    sVar14 = (param->numbers).nStored;
    if (sVar14 != 0) {
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,sVar14,(allocator_type *)&lambda);
      lVar21 = 0;
      while (bVar5 = sVar14 != 0, sVar14 = sVar14 - 1, bVar5) {
        pBVar8 = pstd::pmr::polymorphic_allocator<std::byte>::
                 new_object<pbrt::BlackbodySpectrum,double_const&>
                           (&alloc_local,(double *)((long)(param->numbers).ptr + lVar21));
        *(ulong *)((long)&(((__return_storage_ptr__->
                            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                          ).bits + lVar21) = (ulong)pBVar8 | 0x6000000000000;
        lVar21 = lVar21 + 8;
      }
      return __return_storage_ptr__;
    }
  }
  fmt = "No values provided for \"%s\".";
LAB_0027fbaa:
  ErrorExit<std::__cxx11::string_const&>(&param->loc,fmt,&param->name);
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (spectrumType == SpectrumType::Reflectance) {
                    if (std::min({v[0], v[1], v[2]}) < 0 ||
                        std::max({v[0], v[1], v[2]}) > 1)
                        ErrorExit(&param.loc,
                                  "RGB reflectance parameter \"%s\" has "
                                  "parameter outside of [0,1].",
                                  param.name);
                    return alloc.new_object<RGBReflectanceSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::General);
                    if (std::min({v[0], v[1], v[2]}) < 0)
                        ErrorExit(&param.loc,
                                  "RGB parameter \"%s\" has negative component value.");
                    return alloc.new_object<RGBSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}